

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  PerThreadSynch *pPVar4;
  ulong uVar5;
  int iVar6;
  byte local_8d3;
  byte local_8d2;
  byte local_229;
  char *absl_raw_log_internal_basename_4;
  char *absl_raw_log_internal_basename_3;
  char *absl_raw_log_internal_basename_2;
  intptr_t wr_wait;
  PerThreadSynch *new_h_1;
  PerThreadSynch *h_1;
  PerThreadSynch *h;
  char *absl_raw_log_internal_basename_1;
  intptr_t nv;
  PerThreadSynch *new_h;
  bool dowait;
  char *absl_raw_log_internal_basename;
  intptr_t v;
  ScopedDisable local_19d;
  int c;
  ScopedDisable disable_rescheduling;
  SynchWaitParams *pSStack_198;
  int flags_local;
  SynchWaitParams *waitp_local;
  Mutex *this_local;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  c = flags;
  pSStack_198 = waitp;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable(&local_19d);
  v._4_4_ = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    iVar6 = 6;
    if (pSStack_198->how == (MuHow)kExclusiveS) {
      iVar6 = 4;
    }
    PostSynchEvent(this,iVar6);
  }
  local_229 = 1;
  if (pSStack_198->thread->waitp != (SynchWaitParams *)0x0) {
    local_229 = pSStack_198->thread->suppress_fatal_errors;
  }
  if (((local_229 ^ 0xff) & 1) != 0) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x7bc,"Check %s failed: %s",
               "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
               "detected illegal recursion into Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x7bc,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
  }
  do {
    std::operator&(memory_order_relaxed,__memory_order_mask);
    absl_raw_log_internal_basename = (char *)(this->mu_).super___atomic_base<long>._M_i;
    CheckForMutexCorruption((intptr_t)absl_raw_log_internal_basename,"Lock");
    if (((ulong)absl_raw_log_internal_basename & pSStack_198->how->slow_need_zero) == 0) {
      uVar5 = pSStack_198->how->fast_or;
      uVar3 = ClearDesignatedWakerMask(c & 1);
      LOCK();
      bVar2 = absl_raw_log_internal_basename == (char *)(this->mu_).super___atomic_base<long>._M_i;
      if (bVar2) {
        (this->mu_).super___atomic_base<long>._M_i =
             (uVar5 | (ulong)absl_raw_log_internal_basename & uVar3) + pSStack_198->how->fast_add;
      }
      UNLOCK();
      if (bVar2) {
        if ((pSStack_198->cond == (Condition *)0x0) ||
           (bVar2 = EvalConditionAnnotated
                              (pSStack_198->cond,this,true,false,pSStack_198->how == (MuHow)kSharedS
                              ), bVar2)) {
LAB_0019c2c9:
          local_8d3 = 1;
          if (pSStack_198->thread->waitp != (SynchWaitParams *)0x0) {
            local_8d3 = pSStack_198->thread->suppress_fatal_errors;
          }
          if (((local_8d3 ^ 0xff) & 1) == 0) {
            if (((ulong)absl_raw_log_internal_basename & 0x10) != 0) {
              iVar6 = 7;
              if (pSStack_198->how == (MuHow)kExclusiveS) {
                iVar6 = 5;
              }
              PostSynchEvent(this,iVar6);
            }
            base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable(&local_19d);
            return;
          }
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x823,"Check %s failed: %s",
                     "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
                     "detected illegal recursion into Mutex code");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x823,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
        }
        UnlockSlow(this,pSStack_198);
        Block(this,pSStack_198->thread);
        c = c | 1;
        v._4_4_ = 0;
      }
    }
    else {
      new_h._7_1_ = false;
      if (((ulong)absl_raw_log_internal_basename & 0x44) == 0) {
        pPVar4 = Enqueue((PerThreadSynch *)0x0,pSStack_198,(intptr_t)absl_raw_log_internal_basename,
                         c);
        uVar5 = ClearDesignatedWakerMask(c & 1);
        uVar5 = (ulong)absl_raw_log_internal_basename & uVar5 & 0xff;
        absl_raw_log_internal_basename_1 = (char *)(uVar5 | 4);
        if (pPVar4 == (PerThreadSynch *)0x0) {
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x7d9,"Check %s failed: %s","new_h != nullptr",
                     "Enqueue to empty list failed");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x7d9,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
        }
        if ((pSStack_198->how == (MuHow)kExclusiveS) &&
           (((ulong)absl_raw_log_internal_basename & 1) != 0)) {
          absl_raw_log_internal_basename_1 = (char *)(uVar5 | 0x24);
        }
        LOCK();
        bVar2 = absl_raw_log_internal_basename == (char *)(this->mu_).super___atomic_base<long>._M_i
        ;
        if (bVar2) {
          (this->mu_).super___atomic_base<long>._M_i =
               (ulong)pPVar4 | (ulong)absl_raw_log_internal_basename_1;
        }
        UNLOCK();
        bVar2 = !bVar2;
        if (bVar2) {
          pSStack_198->thread->waitp = (SynchWaitParams *)0x0;
        }
        new_h._7_1_ = !bVar2;
      }
      else {
        uVar5 = pSStack_198->how->slow_inc_need_zero;
        uVar3 = IgnoreWaitingWritersMask(c & 1);
        if (((ulong)absl_raw_log_internal_basename & uVar5 & uVar3) == 0) {
          uVar5 = ClearDesignatedWakerMask(c & 1);
          LOCK();
          bVar2 = absl_raw_log_internal_basename ==
                  (char *)(this->mu_).super___atomic_base<long>._M_i;
          if (bVar2) {
            (this->mu_).super___atomic_base<long>._M_i =
                 (ulong)absl_raw_log_internal_basename & uVar5 | 0x41;
          }
          UNLOCK();
          if (bVar2) {
            pPVar4 = GetPerThreadSynch((intptr_t)absl_raw_log_internal_basename);
            pPVar4->readers = pPVar4->readers + 0x100;
            do {
              std::operator&(memory_order_relaxed,__memory_order_mask);
              absl_raw_log_internal_basename = (char *)(this->mu_).super___atomic_base<long>._M_i;
              LOCK();
              bVar2 = absl_raw_log_internal_basename ==
                      (char *)(this->mu_).super___atomic_base<long>._M_i;
              if (bVar2) {
                (this->mu_).super___atomic_base<long>._M_i =
                     (ulong)absl_raw_log_internal_basename & 0xffffffffffffffbf | 1;
              }
              UNLOCK();
            } while (!bVar2);
            if ((pSStack_198->cond == (Condition *)0x0) ||
               (bVar2 = EvalConditionAnnotated
                                  (pSStack_198->cond,this,true,false,
                                   pSStack_198->how == (MuHow)kSharedS), bVar2)) goto LAB_0019c2c9;
            UnlockSlow(this,pSStack_198);
            Block(this,pSStack_198->thread);
            c = c | 1;
            v._4_4_ = 0;
          }
        }
        else if (((ulong)absl_raw_log_internal_basename & 0x40) == 0) {
          uVar5 = ClearDesignatedWakerMask(c & 1);
          LOCK();
          bVar2 = absl_raw_log_internal_basename ==
                  (char *)(this->mu_).super___atomic_base<long>._M_i;
          if (bVar2) {
            (this->mu_).super___atomic_base<long>._M_i =
                 (ulong)absl_raw_log_internal_basename & uVar5 | 0x44;
          }
          UNLOCK();
          if (bVar2) {
            pPVar4 = GetPerThreadSynch((intptr_t)absl_raw_log_internal_basename);
            pPVar4 = Enqueue(pPVar4,pSStack_198,(intptr_t)absl_raw_log_internal_basename,c);
            absl_raw_log_internal_basename_2 = (char *)0x0;
            if (pPVar4 == (PerThreadSynch *)0x0) {
              raw_log_internal::RawLog
                        (kFatal,"mutex.cc",0x808,"Check %s failed: %s","new_h != nullptr",
                         "Enqueue to list failed");
              __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                            ,0x808,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
            }
            if ((pSStack_198->how == (MuHow)kExclusiveS) &&
               (((ulong)absl_raw_log_internal_basename & 1) != 0)) {
              absl_raw_log_internal_basename_2 = (char *)0x20;
            }
            do {
              std::operator&(memory_order_relaxed,__memory_order_mask);
              lVar1 = (this->mu_).super___atomic_base<long>._M_i;
              LOCK();
              bVar2 = lVar1 == (this->mu_).super___atomic_base<long>._M_i;
              if (bVar2) {
                (this->mu_).super___atomic_base<long>._M_i =
                     (ulong)((uint)lVar1 & 0xbb) | (ulong)absl_raw_log_internal_basename_2 |
                     (ulong)pPVar4 | 4;
              }
              UNLOCK();
            } while (!bVar2);
            new_h._7_1_ = true;
          }
        }
      }
      if (new_h._7_1_) {
        Block(this,pSStack_198->thread);
        c = c | 1;
        v._4_4_ = 0;
      }
    }
    local_8d2 = 1;
    if (pSStack_198->thread->waitp != (SynchWaitParams *)0x0) {
      local_8d2 = pSStack_198->thread->suppress_fatal_errors;
    }
    if (((local_8d2 ^ 0xff) & 1) != 0) {
      raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x81d,"Check %s failed: %s",
                 "waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors",
                 "detected illegal recursion into Mutex code");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x81d,"void absl::Mutex::LockSlowLoop(SynchWaitParams *, int)");
    }
    v._4_4_ = synchronization_internal::MutexDelay(v._4_4_,1);
  } while( true );
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams* waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, waitp->how == kExclusive ? SYNCH_EV_LOCK : SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {  // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {  // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch* h = GetPerThreadSynch(v);
          h->readers += kMuOne;  // inc reader count in waiter
          do {                   // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);  // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;  // give priority to a waiting writer
        }
        do {  // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this, waitp->how == kExclusive
                             ? SYNCH_EV_LOCK_RETURNING
                             : SYNCH_EV_READERLOCK_RETURNING);
  }
}